

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

int co_cond_timedwait(stCoCond_t *link,int ms)

{
  int iVar1;
  stCoCondItem_t *ap;
  stCoRoutine_t *psVar2;
  unsigned_long_long allNow;
  stCoRoutineEnv_t *psVar3;
  int ret;
  unsigned_long_long now;
  stCoCondItem_t *psi;
  int ms_local;
  stCoCond_t *link_local;
  
  ap = (stCoCondItem_t *)calloc(1,0x58);
  psVar2 = GetCurrThreadCo();
  (ap->timeout).pArg = psVar2;
  (ap->timeout).pfnProcess = OnSignalProcessEvent;
  if (0 < ms) {
    allNow = GetTickMS();
    (ap->timeout).ullExpireTime = allNow + (long)ms;
    psVar3 = co_get_curr_thread_env();
    iVar1 = AddTimeout(psVar3->pEpoll->pTimeout,&ap->timeout,allNow);
    if (iVar1 != 0) {
      free(ap);
      return iVar1;
    }
  }
  AddTail<stCoCondItem_t,stCoCond_t>(link,ap);
  co_yield_ct();
  RemoveFromLink<stCoCondItem_t,stCoCond_t>(ap);
  free(ap);
  return 0;
}

Assistant:

int co_cond_timedwait( stCoCond_t *link,int ms )
{
	stCoCondItem_t* psi = (stCoCondItem_t*)calloc(1, sizeof(stCoCondItem_t));
	psi->timeout.pArg = GetCurrThreadCo();
	psi->timeout.pfnProcess = OnSignalProcessEvent;

	if( ms > 0 )
	{
		unsigned long long now = GetTickMS();
		psi->timeout.ullExpireTime = now + ms;

		int ret = AddTimeout( co_get_curr_thread_env()->pEpoll->pTimeout,&psi->timeout,now );
		if( ret != 0 )
		{
			free(psi);
			return ret;
		}
	}
	AddTail( link, psi);

	co_yield_ct();


	RemoveFromLink<stCoCondItem_t,stCoCond_t>( psi );
	free(psi);

	return 0;
}